

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# audio-logger.cpp
# Opt level: O0

bool __thiscall AudioLogger::record(AudioLogger *this,float bufferSize_s,int32_t nPrevFrames)

{
  bool bVar1;
  int32_t iVar2;
  int iVar3;
  Data *pDVar4;
  reference this_00;
  size_type sVar5;
  vector<std::array<float,_512UL>,_std::allocator<std::array<float,_512UL>_>_> *this_01;
  reference pvVar6;
  uint in_ESI;
  int i;
  int fStart;
  value_type *record;
  lock_guard<std::mutex> lock;
  int32_t bufferSize_frames;
  Data *data;
  undefined4 in_stack_ffffffffffffff78;
  float in_stack_ffffffffffffff7c;
  undefined4 in_stack_ffffffffffffff80;
  undefined4 in_stack_ffffffffffffff84;
  array<std::array<float,_512UL>,_939UL> *this_02;
  int local_48;
  int local_44;
  bool local_1;
  
  pDVar4 = getData((AudioLogger *)0x1ac665);
  bVar1 = isValidBufferSize((AudioLogger *)
                            CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78),0.0);
  if (bVar1) {
    iVar2 = getBufferSize_frames
                      (CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
                       in_stack_ffffffffffffff7c);
    if ((int)in_ESI < iVar2) {
      std::lock_guard<std::mutex>::lock_guard
                ((lock_guard<std::mutex> *)
                 CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
                 (mutex_type *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
      if (pDVar4->nRecords == 0x10) {
        fprintf(_stderr,"warning : max number of simultaneous records %d reached\n",0x10);
        local_1 = false;
      }
      else {
        this_00 = std::
                  array<std::vector<std::array<float,_512UL>,_std::allocator<std::array<float,_512UL>_>_>,_16UL>
                  ::operator[]((array<std::vector<std::array<float,_512UL>,_std::allocator<std::array<float,_512UL>_>_>,_16UL>
                                *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
                               CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
        sVar5 = std::vector<std::array<float,_512UL>,_std::allocator<std::array<float,_512UL>_>_>::
                size(this_00);
        if (sVar5 == 0) {
          local_44 = pDVar4->bufferId - in_ESI;
          if (local_44 < 0) {
            sVar5 = std::array<std::array<float,_512UL>,_939UL>::size(&pDVar4->buffer);
            local_44 = local_44 + (int)sVar5;
          }
          for (local_48 = 0; local_48 < (int)in_ESI; local_48 = local_48 + 1) {
            this_02 = &pDVar4->buffer;
            this_01 = (vector<std::array<float,_512UL>,_std::allocator<std::array<float,_512UL>_>_>
                       *)(long)(local_44 + local_48);
            std::array<std::array<float,_512UL>,_939UL>::size(this_02);
            std::array<std::array<float,_512UL>,_939UL>::operator[]
                      ((array<std::array<float,_512UL>,_939UL> *)
                       CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
                       CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
            std::vector<std::array<float,_512UL>,_std::allocator<std::array<float,_512UL>_>_>::
            push_back(this_01,this_02->_M_elems);
          }
        }
        else {
          fprintf(_stderr,
                  "warning : new record requested before last has been processed. should never happen\n"
                 );
        }
        iVar3 = iVar2 - in_ESI;
        pvVar6 = std::array<int,_16UL>::operator[]
                           ((array<int,_16UL> *)CONCAT44(iVar3,in_stack_ffffffffffffff80),
                            CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
        *pvVar6 = iVar3;
        pDVar4->nRecords = pDVar4->nRecords + 1;
        local_1 = true;
      }
      std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)0x1ac8b6);
    }
    else {
      fprintf(_stderr,
              "warning : invalid previous frames in record requested - %d. max allowed is %d s\n",
              (ulong)in_ESI,(ulong)(iVar2 - 1));
      local_1 = false;
    }
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool AudioLogger::record(float bufferSize_s, int32_t nPrevFrames) {
    auto & data = getData();

    if (isValidBufferSize(bufferSize_s) == false) {
        return false;
    }

    auto bufferSize_frames = getBufferSize_frames(data.parameters.sampleRate, bufferSize_s);

    if (nPrevFrames >= bufferSize_frames) {
        fprintf(stderr, "warning : invalid previous frames in record requested - %d. max allowed is %d s\n", nPrevFrames, bufferSize_frames - 1);
        return false;
    }

    std::lock_guard<std::mutex> lock(data.mutex);

    if (data.nRecords == kMaxRecords) {
        fprintf(stderr, "warning : max number of simultaneous records %d reached\n", kMaxRecords);
        return false;
    }

    auto & record = data.records[data.nRecords];

    if (record.size() == 0) {
        int fStart = data.bufferId - nPrevFrames;
        if (fStart < 0) fStart += data.buffer.size();
        for (int i = 0; i < nPrevFrames; ++i) {
            record.push_back(data.buffer[(fStart + i)%data.buffer.size()]);
        }
    } else {
        fprintf(stderr, "warning : new record requested before last has been processed. should never happen\n");
    }

    data.nFramesToRecord[data.nRecords] = bufferSize_frames - nPrevFrames;

    ++data.nRecords;

    return true;
}